

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int Disconnectubloxx(UBLOX *publox)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  timespec local_30;
  
  lVar4 = 0;
  while ((UBLOX *)addrsublox[lVar4] != publox) {
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x10) {
      return 1;
    }
  }
  if (publox->bSendStopSentence == 0) {
LAB_0010b4da:
    iVar2 = CloseRS232Port(&publox->RS232Port);
    if (iVar2 == 0) {
      puts("ublox disconnected.");
      iVar2 = 0;
      bVar1 = true;
      goto LAB_0010b50b;
    }
    puts("ublox disconnection failed.");
  }
  else {
    sVar3 = strlen(publox->szStopSentence);
    iVar2 = TransferToublox(publox,(uchar *)publox->szStopSentence,(int)sVar3);
    if (iVar2 == 0) {
      local_30.tv_sec = 0;
      local_30.tv_nsec = 50000000;
      nanosleep(&local_30,(timespec *)0x0);
      goto LAB_0010b4da;
    }
    puts("Error while disconnecting a ublox.");
    CloseRS232Port(&publox->RS232Port);
  }
  iVar2 = 1;
  bVar1 = false;
LAB_0010b50b:
  if (!bVar1) {
    return iVar2;
  }
  addrsublox[lVar4] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int Disconnectubloxx(UBLOX* publox)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Disconnectublox(publox);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = NULL;

	return EXIT_SUCCESS;
}